

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::Resize
          (TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_> *this,int64_t newsize)

{
  ulong uVar1;
  TPZReference *pTVar2;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar3;
  ostream *poVar4;
  int64_t *piVar5;
  ulong uVar6;
  long lVar7;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar8;
  long lVar9;
  bool bVar10;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar3 = this->fStore;
      if (pTVar3 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
        pTVar2 = pTVar3[-1].fRef;
        if (pTVar2 != (TPZReference *)0x0) {
          lVar9 = (long)pTVar2 * 8;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar3[-1].fRef + lVar9));
            lVar9 = lVar9 + -8;
          } while (lVar9 != 0);
        }
        operator_delete__(pTVar3 + -1,(long)pTVar2 * 8 + 8);
      }
      this->fStore = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0;
    }
    else {
      uVar1 = newsize * 8;
      uVar6 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff8) {
        uVar6 = uVar1 + 8;
      }
      lVar9 = 0;
      piVar5 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | uVar6);
      *piVar5 = newsize;
      pTVar3 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar5 + 1);
      pTVar8 = pTVar3;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(pTVar8);
        lVar9 = lVar9 + -8;
        pTVar8 = pTVar8 + 1;
      } while (-lVar9 != uVar1);
      lVar9 = this->fNElements;
      if (newsize <= this->fNElements) {
        lVar9 = newsize;
      }
      lVar7 = 0;
      if (lVar9 < 1) {
        lVar9 = lVar7;
      }
      while( true ) {
        pTVar8 = this->fStore;
        bVar10 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if (bVar10) break;
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                  ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                   ((long)&pTVar3->fRef + lVar7),
                   (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                   ((long)&pTVar8->fRef + lVar7));
        lVar7 = lVar7 + 8;
      }
      if (pTVar8 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
        pTVar2 = pTVar8[-1].fRef;
        if (pTVar2 != (TPZReference *)0x0) {
          lVar9 = (long)pTVar2 * 8;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar8[-1].fRef + lVar9));
            lVar9 = lVar9 + -8;
          } while (lVar9 != 0);
        }
        operator_delete__(pTVar8 + -1,(long)pTVar2 * 8 + 8);
      }
      this->fStore = pTVar3;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}